

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::unary_expr(analysis *this)

{
  string *__return_storage_ptr__;
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar2;
  NodePtr tmp_in_ptr;
  NodePtr tmp_ptr;
  NodePtr tmp_cur_ptr;
  string tmp_str;
  undefined1 local_118 [32];
  string local_f8;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_c0;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  local_68 = 0;
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8._M_ptr = (element_type *)0x0;
  local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60[0] = 0;
  token::getVal_abi_cxx11_
            ((string *)local_118,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_118,"+");
  if (!bVar1) {
    token::getVal_abi_cxx11_
              ((string *)(local_118 + 0x20),
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_118 + 0x20),"-");
    if (!bVar1) {
      token::getVal_abi_cxx11_
                (&local_b0,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = std::operator==(&local_b0,"!");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)(local_118 + 0x20));
      std::__cxx11::string::~string((string *)local_118);
      if (!bVar1) {
        primary_expr((analysis *)local_118);
        std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_118);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
        std::__cxx11::string::~string((string *)&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
        NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
      }
      goto LAB_00117cf9;
    }
    std::__cxx11::string::~string((string *)(local_118 + 0x20));
  }
  std::__cxx11::string::~string((string *)local_118);
LAB_00117cf9:
  token::getVal_abi_cxx11_
            ((string *)local_118,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_b0._M_dataplus._M_p._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  std::make_shared<dh::TreeNode,std::__cxx11::string,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_118 + 0x20)
             ,(int *)local_118);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
  std::__cxx11::string::~string((string *)local_118);
  local_118._0_4_ = 1;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_118);
  local_118._0_4_ = 7;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_118);
  token::getVal_abi_cxx11_
            (&local_90,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  match(in_RSI,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  __return_storage_ptr__ = (string *)(local_118 + 0x20);
  do {
    while( true ) {
      token::getVal_abi_cxx11_
                ((string *)local_118,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_118,"+");
      if (bVar1) break;
      token::getVal_abi_cxx11_
                (__return_storage_ptr__,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = std::operator==(__return_storage_ptr__,"-");
      if (bVar1) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        break;
      }
      token::getVal_abi_cxx11_
                (&local_b0,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = std::operator==(&local_b0,"!");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_118);
      if (bVar1) goto LAB_00117e09;
      primary_expr((analysis *)local_118);
      std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_d8,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
      TreeNode::appendChild(local_c0._M_ptr,(NodePtr *)&local_d8);
    }
    std::__cxx11::string::~string((string *)local_118);
LAB_00117e09:
    token::getVal_abi_cxx11_
              ((string *)local_118,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_b0._M_dataplus._M_p._0_4_ =
         token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    std::make_shared<dh::TreeNode,std::__cxx11::string,int>(__return_storage_ptr__,(int *)local_118)
    ;
    std::__cxx11::string::~string((string *)local_118);
    local_118._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)local_f8._M_dataplus._M_p,(int *)local_118);
    local_118._0_4_ = 7;
    TreeNode::setKind((TreeNode *)local_f8._M_dataplus._M_p,(int *)local_118);
    token::getVal_abi_cxx11_
              (&local_50,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    TreeNode::appendChild(local_c0._M_ptr,(NodePtr *)__return_storage_ptr__);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c0,
               (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
  } while( true );
}

Assistant:

NodePtr analysis::unary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in unary_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr;
	::std::string tmp_str;

	if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::UnaryK);

		match(tmp->getVal());
	} else 
	{
		ret = primary_expr();
		return ret;
	}

	NodePtr tmp_cur_ptr = ret;
	while(1)
	{
		if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
		{
			NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
			tmp_in_ptr->setNodeKind(NodeKind::ExprK);
			tmp_in_ptr->setKind(ExprKind::UnaryK);

			match(tmp->getVal());
			tmp_cur_ptr->appendChild(tmp_in_ptr);
			tmp_cur_ptr = tmp_in_ptr;
		} else 
		{
			tmp_ptr = primary_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);
		}
	}

	return ret;
}